

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.cpp
# Opt level: O0

double asl::log(double __x)

{
  bool bVar1;
  char in_AL;
  char *__s;
  Log *this;
  undefined8 in_RDX;
  double __x_00;
  double extraout_XMM0_Qa;
  int local_148;
  undefined1 local_128 [48];
  double local_f8;
  int local_64;
  int local_60;
  int space;
  int n;
  int i;
  va_list arg;
  undefined1 local_38 [8];
  String message;
  char *fmt_local;
  Level level_local;
  String *cat_local;
  
  if (in_AL != '\0') {
    local_f8 = __x;
  }
  message.field_2._8_8_ = in_RDX;
  String::String((String *)local_38,100,0);
  arg[0].overflow_arg_area = local_128;
  arg[0]._0_8_ = &stack0x00000008;
  i = 0x30;
  n = 0x18;
  space = 0;
  local_60 = 0;
  local_64 = String::cap((String *)local_38);
  while( true ) {
    __s = String::data((String *)local_38);
    local_60 = vsnprintf(__s,(long)local_64,(char *)message.field_2._8_8_,&n);
    if ((local_60 == -1) || (bVar1 = false, local_64 <= local_60)) {
      space = space + 1;
      bVar1 = space < 10;
    }
    if (!bVar1) break;
    local_148 = local_60;
    if (local_60 < local_64) {
      local_148 = local_64 << 1;
    }
    String::resize((String *)local_38,local_148,false,true);
    local_64 = String::cap((String *)local_38);
    arg[0].overflow_arg_area = local_128;
    arg[0]._0_8_ = &stack0x00000008;
    i = 0x30;
    n = 0x18;
  }
  String::fix((String *)local_38,local_60);
  this = Singleton<asl::Log>::instance();
  Log::log(this,__x_00);
  String::~String((String *)local_38);
  return extraout_XMM0_Qa;
}

Assistant:

void log(const String& cat, Log::Level level, ASL_PRINTF_W1 const char* fmt, ...)
{
	String message(100, 0);
	va_list arg;
	va_start(arg, fmt);
	int i = 0, n = 0;
	int space = message.cap();
	while (((n = vsnprintf(message.data(), space, fmt, arg)) == -1 || n >= space) && ++i < 10)
	{
		message.resize((n >= space) ? n : 2 * space, false);
		space = message.cap();
		va_end(arg);
		va_start(arg, fmt);
	}
	va_end(arg);
	message.fix(n);

	Log::instance()->log(cat, level, message);
}